

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::learn_MTR<true>(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  label *cs_labels;
  float fVar1;
  example *peVar2;
  action_score *paVar3;
  action_score *paVar4;
  undefined8 uVar5;
  action_score *paVar6;
  action_score *paVar7;
  size_t sVar8;
  action_score *paVar9;
  size_t sVar10;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  v_array<ACTION_SCORE::action_score> __tmp;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar12 [16];
  
  cs_labels = &mydata->cs_labels;
  GEN_CS::gen_cs_example_ips(examples,cs_labels);
  GEN_CS::call_cs_ldf<false>
            (base,examples,&mydata->cb_labels,cs_labels,&mydata->prepped_cs_labels,mydata->offset,0)
  ;
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar3 = (action_score *)(peVar2->pred).scalars._begin;
  paVar4 = (action_score *)(peVar2->pred).scalars._end;
  uVar5 = *(undefined8 *)((long)&peVar2->pred + 0x10);
  sVar10 = (peVar2->pred).scalars.erase_count;
  paVar6 = (mydata->a_s)._begin;
  paVar7 = (mydata->a_s)._end;
  sVar8 = (mydata->a_s).erase_count;
  (peVar2->pred).scalars.end_array = (float *)(mydata->a_s).end_array;
  (peVar2->pred).scalars.erase_count = sVar8;
  (peVar2->pred).scalars._begin = (float *)paVar6;
  (peVar2->pred).scalars._end = (float *)paVar7;
  local_48 = (undefined4)uVar5;
  uStack_44 = (undefined4)((ulong)uVar5 >> 0x20);
  uStack_40 = (undefined4)sVar10;
  uStack_3c = (undefined4)(sVar10 >> 0x20);
  *(undefined4 *)&(mydata->a_s).end_array = local_48;
  *(undefined4 *)((long)&(mydata->a_s).end_array + 4) = uStack_44;
  *(undefined4 *)&(mydata->a_s).erase_count = uStack_40;
  *(undefined4 *)((long)&(mydata->a_s).erase_count + 4) = uStack_3c;
  (mydata->a_s)._begin = paVar3;
  (mydata->a_s)._end = paVar4;
  GEN_CS::gen_cs_example_mtr(&mydata->gen_cs,examples,cs_labels);
  peVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(mydata->gen_cs).mtr_example];
  sVar10 = peVar2->num_features;
  fVar1 = peVar2->weight;
  auVar12._0_8_ = (undefined8)DAT_002400b0;
  auVar12._8_4_ = DAT_002400b0._4_4_;
  auVar12._12_4_ = extraout_XMM0_Db;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._0_4_ = (undefined4)DAT_002400b0;
  auVar11._4_4_ = (float)(mydata->gen_cs).event_sum;
  auVar13._4_4_ = (float)(mydata->gen_cs).action_sum;
  auVar13._0_4_ = ((peVar2->l).cs.costs._begin)->partial_prediction;
  auVar13._8_4_ = 0;
  auVar13._12_4_ = uStack_44;
  auVar13 = divps(auVar11,auVar13);
  peVar2->weight = auVar13._4_4_ * auVar13._0_4_ * fVar1;
  GEN_CS::call_cs_ldf<true>
            (base,&(mydata->gen_cs).mtr_ec_seq,&mydata->cb_labels,cs_labels,
             &mydata->prepped_cs_labels,mydata->offset,0);
  (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
  super__Vector_impl_data._M_start[(mydata->gen_cs).mtr_example]->num_features = (ulong)(uint)sVar10
  ;
  (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
  super__Vector_impl_data._M_start[(mydata->gen_cs).mtr_example]->weight = fVar1;
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar3 = (action_score *)(peVar2->pred).scalars._begin;
  paVar4 = (action_score *)(peVar2->pred).scalars._end;
  paVar6 = (action_score *)(peVar2->pred).scalars.end_array;
  sVar10 = (peVar2->pred).scalars.erase_count;
  paVar7 = (mydata->a_s)._begin;
  paVar9 = (mydata->a_s)._end;
  sVar8 = (mydata->a_s).erase_count;
  (peVar2->pred).scalars.end_array = (float *)(mydata->a_s).end_array;
  (peVar2->pred).scalars.erase_count = sVar8;
  (peVar2->pred).scalars._begin = (float *)paVar7;
  (peVar2->pred).scalars._end = (float *)paVar9;
  (mydata->a_s).end_array = paVar6;
  (mydata->a_s).erase_count = sVar10;
  (mydata->a_s)._begin = paVar3;
  (mydata->a_s)._end = paVar4;
  return;
}

Assistant:

void learn_MTR(cb_adf& mydata, multi_learner& base, multi_ex& examples)
{
  // uint32_t action = 0;
  if (predict)  // first get the prediction to return
  {
    gen_cs_example_ips(examples, mydata.cs_labels);
    call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
    swap(examples[0]->pred.a_s, mydata.a_s);
  }
  // second train on _one_ action (which requires up to 3 examples).
  // We must go through the cost sensitive classifier layer to get
  // proper feature handling.
  gen_cs_example_mtr(mydata.gen_cs, examples, mydata.cs_labels);
  uint32_t nf = (uint32_t)examples[mydata.gen_cs.mtr_example]->num_features;
  float old_weight = examples[mydata.gen_cs.mtr_example]->weight;
  examples[mydata.gen_cs.mtr_example]->weight *= 1.f / examples[mydata.gen_cs.mtr_example]->l.cb.costs[0].probability *
      ((float)mydata.gen_cs.event_sum / (float)mydata.gen_cs.action_sum);
  GEN_CS::call_cs_ldf<true>(
      base, mydata.gen_cs.mtr_ec_seq, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
  examples[mydata.gen_cs.mtr_example]->num_features = nf;
  examples[mydata.gen_cs.mtr_example]->weight = old_weight;
  swap(examples[0]->pred.a_s, mydata.a_s);
}